

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall
RoboClaw::ReadM2VelocityPID(RoboClaw *this,float *Kp_fp,float *Ki_fp,float *Kd_fp,uint32_t *qpps)

{
  bool bVar1;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  RoboClaw *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  bool valid;
  uint32_t Kd;
  uint32_t Ki;
  uint32_t Kp;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c [3];
  float *local_20;
  float *local_18;
  float *local_10;
  
  auVar2 = in_ZMM0._0_16_;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = read_n(in_RDI,'\x04',(uint8_t)(ulong)in_RDI->m_address,'8',local_2c,&local_30,&local_34);
  auVar2 = vcvtusi2ss_avx512f(auVar2,local_2c[0]);
  auVar3._0_4_ = auVar2._0_4_ / 65536.0;
  auVar3._4_12_ = auVar2._4_12_;
  *local_10 = auVar3._0_4_;
  auVar2 = vcvtusi2ss_avx512f(auVar3,local_30);
  auVar4._0_4_ = auVar2._0_4_ / 65536.0;
  auVar4._4_12_ = auVar2._4_12_;
  *local_18 = auVar4._0_4_;
  auVar2 = vcvtusi2ss_avx512f(auVar4,local_34);
  *local_20 = auVar2._0_4_ / 65536.0;
  return bVar1;
}

Assistant:

bool RoboClaw::ReadM2VelocityPID( float &Kp_fp,float &Ki_fp,float &Kd_fp,uint32_t &qpps)
{
    uint32_t Kp,Ki,Kd;
    bool valid = read_n(4, m_address, READM2PID,&Kp,&Ki,&Kd,&qpps);
    Kp_fp = ((float)Kp)/65536;
    Ki_fp = ((float)Ki)/65536;
    Kd_fp = ((float)Kd)/65536;
    return valid;
}